

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O3

void __thiscall TinyGC::TinyGC(TinyGC *this)

{
  Visitor *pVVar1;
  
  (this->objs_addr_)._M_h._M_buckets = &(this->objs_addr_)._M_h._M_single_bucket;
  (this->objs_addr_)._M_h._M_bucket_count = 1;
  (this->objs_addr_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->objs_addr_)._M_h._M_element_count = 0;
  (this->objs_addr_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->objs_addr_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->objs_addr_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->thread_to_stack_)._M_h._M_buckets = &(this->thread_to_stack_)._M_h._M_single_bucket;
  (this->thread_to_stack_)._M_h._M_bucket_count = 1;
  (this->thread_to_stack_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_to_stack_)._M_h._M_element_count = 0;
  (this->thread_to_stack_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->thread_to_stack_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->thread_to_stack_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ts_mxt_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ts_mxt_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->ts_mxt_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->ts_mxt_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->ts_mxt_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->alloc_mxt_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->alloc_mxt_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->alloc_mxt_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->alloc_mxt_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->alloc_mxt_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pVVar1 = (Visitor *)operator_new(1);
  pVVar1->mark_ = false;
  this->visitor_ = pVVar1;
  this->gc_phase_ = kNone;
  this->bytes_allocated_ = 0;
  this->size_of_objects_ = 0;
  this->gc_count_threshold_ = 0x78;
  this->gc_bytes_threshold_ = 0x1000;
  return;
}

Assistant:

TinyGC::TinyGC()
    : visitor_(new Visitor()),
      gc_phase_(GCPhase::kNone),
      bytes_allocated_(0),
      size_of_objects_(0),
      gc_count_threshold_(120),
      gc_bytes_threshold_(0x1000) {}